

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitting_filter.cc
# Opt level: O2

void __thiscall
webrtc::SplittingFilter::Synthesis
          (SplittingFilter *this,IFChannelBuffer *bands,IFChannelBuffer *data)

{
  size_t sVar1;
  int line;
  string *result;
  size_t local_198;
  FatalMessage local_190;
  
  local_190._0_8_ = (bands->ibuf_).num_bands_;
  result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     (&this->num_bands_,(unsigned_long *)&local_190,
                      "num_bands_ == bands->num_bands()");
  if (result == (string *)0x0) {
    local_190._0_8_ = (data->ibuf_).num_channels_;
    local_198 = (bands->ibuf_).num_channels_;
    result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_190,&local_198,
                        "data->num_channels() == bands->num_channels()");
    if (result == (string *)0x0) {
      local_190._0_8_ = (data->ibuf_).num_frames_;
      local_198 = (bands->ibuf_).num_bands_ * (bands->ibuf_).num_frames_per_band_;
      result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_190,&local_198,
                          "data->num_frames() == bands->num_frames_per_band() * bands->num_bands()")
      ;
      if (result == (string *)0x0) {
        sVar1 = (bands->ibuf_).num_bands_;
        if (sVar1 == 3) {
          ThreeBandsSynthesis(this,bands,data);
        }
        else if (sVar1 == 2) {
          TwoBandsSynthesis(this,bands,data);
        }
        return;
      }
      line = 0x34;
    }
    else {
      line = 0x32;
    }
  }
  else {
    line = 0x31;
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/splitting_filter.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

void SplittingFilter::Synthesis(const IFChannelBuffer* bands,
                                IFChannelBuffer* data) {
  RTC_DCHECK_EQ(num_bands_, bands->num_bands());
  RTC_DCHECK_EQ(data->num_channels(), bands->num_channels());
  RTC_DCHECK_EQ(data->num_frames(),
                bands->num_frames_per_band() * bands->num_bands());
  if (bands->num_bands() == 2) {
    TwoBandsSynthesis(bands, data);
  } else if (bands->num_bands() == 3) {
    ThreeBandsSynthesis(bands, data);
  }
}